

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

void ot::commissioner::HandleMbedtlsDebug(void *param_1,int level,char *file,int line,char *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string local_b8;
  string local_98;
  undefined1 local_78 [32];
  undefined8 local_58;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  if (level == 3) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mbedtls","");
    local_78._0_4_ = cstring_type;
    local_78._4_4_ = int_type;
    local_78._8_4_ = cstring_type;
    local_78._16_8_ = "{}, {}: {}";
    local_78._24_8_ = 10;
    local_58._0_4_ = 0;
    local_58._4_4_ = 3;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_40 = ::fmt::v10::detail::
                 parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_38 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "{}, {}: {}";
    local_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_78;
    do {
      pcVar2 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char_const*,int,char_const*>&>
                           (pcVar3,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_78);
      }
      pcVar3 = pcVar2;
    } while (pcVar2 != "");
    local_78._16_8_ = ZEXT48((uint)line);
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_78;
    fmt_01.size_ = 0xc1c;
    fmt_01.data_ = (char *)0xa;
    local_78._0_8_ = file;
    local_58 = str;
    ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"{}, {}: {}",fmt_01,args_01);
    Log(kInfo,&local_b8,&local_98);
  }
  else if (level == 2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mbedtls","");
    local_78._0_4_ = cstring_type;
    local_78._4_4_ = int_type;
    local_78._8_4_ = cstring_type;
    local_78._16_8_ = "{}, {}: {}";
    local_78._24_8_ = 10;
    local_58._0_4_ = 0;
    local_58._4_4_ = 3;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_40 = ::fmt::v10::detail::
                 parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_38 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "{}, {}: {}";
    local_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_78;
    do {
      pcVar2 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char_const*,int,char_const*>&>
                           (pcVar3,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_78);
      }
      pcVar3 = pcVar2;
    } while (pcVar2 != "");
    local_78._16_8_ = ZEXT48((uint)line);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_78;
    fmt_00.size_ = 0xc1c;
    fmt_00.data_ = (char *)0xa;
    local_78._0_8_ = file;
    local_58 = str;
    ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"{}, {}: {}",fmt_00,args_00);
    Log(kWarn,&local_b8,&local_98);
  }
  else if (level == 1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mbedtls","");
    local_78._0_4_ = cstring_type;
    local_78._4_4_ = int_type;
    local_78._8_4_ = cstring_type;
    local_78._16_8_ = "{}, {}: {}";
    local_78._24_8_ = 10;
    local_58._0_4_ = 0;
    local_58._4_4_ = 3;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_40 = ::fmt::v10::detail::
                 parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_38 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "{}, {}: {}";
    local_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_78;
    do {
      pcVar2 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char_const*,int,char_const*>&>
                           (pcVar3,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_78);
      }
      pcVar3 = pcVar2;
    } while (pcVar2 != "");
    local_78._16_8_ = ZEXT48((uint)line);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_78;
    fmt.size_ = 0xc1c;
    fmt.data_ = (char *)0xa;
    local_78._0_8_ = file;
    local_58 = str;
    ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"{}, {}: {}",fmt,args);
    Log(kCritical,&local_b8,&local_98);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mbedtls","");
    local_78._0_4_ = cstring_type;
    local_78._4_4_ = int_type;
    local_78._8_4_ = cstring_type;
    local_78._16_8_ = "{}, {}: {}";
    local_78._24_8_ = 10;
    local_58._0_4_ = 0;
    local_58._4_4_ = 3;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_40 = ::fmt::v10::detail::
                 parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_38 = ::fmt::v10::detail::
               parse_format_specs<char_const*,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "{}, {}: {}";
    local_50 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_78;
    do {
      pcVar2 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char_const*,int,char_const*>&>
                           (pcVar3,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_78);
      }
      pcVar3 = pcVar2;
    } while (pcVar2 != "");
    local_78._16_8_ = ZEXT48((uint)line);
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_78;
    fmt_02.size_ = 0xc1c;
    fmt_02.data_ = (char *)0xa;
    local_78._0_8_ = file;
    local_58 = str;
    ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"{}, {}: {}",fmt_02,args_02);
    Log(kDebug,&local_b8,&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void HandleMbedtlsDebug(void *, int level, const char *file, int line, const char *str)
{
    switch (level)
    {
    case 1:
        LOG_CRIT(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;

    case 2:
        LOG_WARN(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;

    case 3:
        LOG_INFO(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;

    case 4:
    default:
        LOG_DEBUG(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;
    }
}